

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

uint __thiscall dynamicgraph::command::Value::unsignedValue(Value *this)

{
  ExceptionAbstract *this_00;
  allocator<char> local_3d;
  int local_3c;
  string local_38;
  
  if (this->type_ == UNSIGNED) {
    return *this->value_;
  }
  this_00 = (ExceptionAbstract *)__cxa_allocate_exception(0x30);
  local_3c = 700;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"value is not an unsigned int",&local_3d);
  ExceptionAbstract::ExceptionAbstract(this_00,&local_3c,&local_38);
  __cxa_throw(this_00,&ExceptionAbstract::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

unsigned Value::unsignedValue() const {
  if (type_ == UNSIGNED) return *((const unsigned *)value_);
  throw ExceptionAbstract(ExceptionAbstract::TOOLS,
                          "value is not an unsigned int");
}